

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O1

lzma_index_hash * lzma_index_hash_init(lzma_index_hash *index_hash,lzma_allocator *allocator)

{
  if ((index_hash == (lzma_index_hash *)0x0) &&
     (index_hash = (lzma_index_hash *)lzma_alloc(0x140,allocator),
     index_hash == (lzma_index_hash *)0x0)) {
    return (lzma_index_hash *)0x0;
  }
  index_hash->sequence = SEQ_BLOCK;
  (index_hash->blocks).blocks_size = 0;
  (index_hash->blocks).uncompressed_size = 0;
  (index_hash->blocks).count = 0;
  (index_hash->blocks).index_list_size = 0;
  (index_hash->records).blocks_size = 0;
  (index_hash->records).uncompressed_size = 0;
  (index_hash->records).count = 0;
  (index_hash->records).index_list_size = 0;
  index_hash->unpadded_size = 0;
  index_hash->uncompressed_size = 0;
  *(undefined8 *)((long)&index_hash->uncompressed_size + 4) = 0;
  *(undefined8 *)((long)&index_hash->pos + 4) = 0;
  lzma_check_init(&(index_hash->blocks).check,LZMA_CHECK_SHA256);
  lzma_check_init(&(index_hash->records).check,LZMA_CHECK_SHA256);
  return index_hash;
}

Assistant:

extern LZMA_API(lzma_index_hash *)
lzma_index_hash_init(lzma_index_hash *index_hash, lzma_allocator *allocator)
{
	if (index_hash == NULL) {
		index_hash = lzma_alloc(sizeof(lzma_index_hash), allocator);
		if (index_hash == NULL)
			return NULL;
	}

	index_hash->sequence = SEQ_BLOCK;
	index_hash->blocks.blocks_size = 0;
	index_hash->blocks.uncompressed_size = 0;
	index_hash->blocks.count = 0;
	index_hash->blocks.index_list_size = 0;
	index_hash->records.blocks_size = 0;
	index_hash->records.uncompressed_size = 0;
	index_hash->records.count = 0;
	index_hash->records.index_list_size = 0;
	index_hash->unpadded_size = 0;
	index_hash->uncompressed_size = 0;
	index_hash->pos = 0;
	index_hash->crc32 = 0;

	// These cannot fail because LZMA_CHECK_BEST is known to be supported.
	(void)lzma_check_init(&index_hash->blocks.check, LZMA_CHECK_BEST);
	(void)lzma_check_init(&index_hash->records.check, LZMA_CHECK_BEST);

	return index_hash;
}